

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.cpp
# Opt level: O3

PureFunctionCall * __thiscall
soul::BlockBuilder::createMinInt32(BlockBuilder *this,Expression *a,Expression *b)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Module *m;
  Function *args_1;
  PureFunctionCall *pPVar2;
  string local_88;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  Type local_48;
  
  iVar1 = (*(a->super_Object)._vptr_Object[2])(a);
  if (*(int *)(CONCAT44(extraout_var,iVar1) + 4) == 7) {
    iVar1 = (*(b->super_Object)._vptr_Object[2])(b);
    if (*(int *)(CONCAT44(extraout_var_00,iVar1) + 4) == 7) {
      m = anon_unknown.dwarf_732c3::getInternalModule(&this->module->program);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"_minInt32","");
      local_48.category = primitive;
      local_48.arrayElementCategory = invalid;
      local_48.isRef = false;
      local_48.isConstant = false;
      local_48.primitiveType.type = int32;
      local_48.boundingSize = 0;
      local_48.arrayElementBoundingSize = 0;
      local_48.structure.object = (Structure *)0x0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      local_50 = std::
                 _Function_handler<void_(soul::FunctionBuilder_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/heart/soul_heart_FunctionBuilder.cpp:46:116)>
                 ::_M_invoke;
      local_58 = std::
                 _Function_handler<void_(soul::FunctionBuilder_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonhochrein[P]soul-lsp/vendor/SOUL/source/modules/soul_core/heart/soul_heart_FunctionBuilder.cpp:46:116)>
                 ::_M_manager;
      args_1 = FunctionBuilder::getOrCreateFunction
                         (m,&local_88,&local_48,
                          (function<void_(soul::FunctionBuilder_&)> *)&local_68);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
      RefCountedPtr<soul::Structure>::decIfNotNull(local_48.structure.object);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      pPVar2 = PoolAllocator::
               allocate<soul::heart::PureFunctionCall,soul::CodeLocation&,soul::heart::Function&>
                         (&this->module->allocator->pool,&(a->super_Object).location,args_1);
      local_88._M_dataplus._M_p = (pointer)a;
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul>::
      push_back<soul::heart::Expression&>
                ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,4ul> *)
                 &pPVar2->arguments,(pool_ref<soul::heart::Expression> *)&local_88,b);
      return pPVar2;
    }
  }
  throwInternalCompilerError
            ("a.getType().isInteger32() && b.getType().isInteger32()","createMinInt32",0x2a);
}

Assistant:

heart::PureFunctionCall& BlockBuilder::createMinInt32 (heart::Expression& a, heart::Expression& b)
{
    SOUL_ASSERT (a.getType().isInteger32() && b.getType().isInteger32());

    auto& internalModule = getInternalModule (module.program);

    auto& function = soul::FunctionBuilder::getOrCreateFunction (internalModule, minInt32Fn, PrimitiveType::int32, [] (FunctionBuilder& builder)
    {
        auto& paramA = builder.addParameter ("a", PrimitiveType::int32);
        auto& paramB = builder.addParameter ("b", PrimitiveType::int32);

        auto& lessThan = builder.createBlock ("@lessThan");
        auto& moreThan = builder.createBlock ("@moreThan");

        builder.addBranchIf (builder.createComparisonOp (paramA, paramB, BinaryOp::Op::lessThan), lessThan, moreThan, lessThan);
        builder.addReturn (paramA);
        builder.beginBlock (moreThan);
        builder.addReturn (paramB);
    });

    auto& call = module.allocate<heart::PureFunctionCall> (a.location, function);
    call.arguments.push_back (a, b);
    return call;
}